

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O0

Few<r3d::Plane<2>,_3> *
r3d::faces_from_verts
          (Few<r3d::Plane<2>,_3> *__return_storage_ptr__,Few<r3d::Vector<2>,_3> *vertices)

{
  double dVar1;
  double dVar2;
  Vector<2> *pVVar3;
  double *pdVar4;
  Plane<2> *pPVar5;
  Real RVar6;
  Vector<2> local_90;
  Vector<2> local_80;
  Vector<2> local_70;
  Vector<2> local_60;
  undefined1 local_4d;
  undefined1 local_40 [8];
  Vector<2> p1;
  Vector<2> p0;
  Int f;
  Int numverts;
  Few<r3d::Vector<2>,_3> *vertices_local;
  Few<r3d::Plane<2>,_3> *faces;
  
  Vector<2>::Vector((Vector<2> *)&p1.super_Few<double,_2>.array_[1].__align);
  Vector<2>::Vector((Vector<2> *)local_40);
  local_4d = 0;
  Few<r3d::Plane<2>,_3>::Few(__return_storage_ptr__);
  for (p0.super_Few<double,_2>.array_[1]._0_4_ = 0; (int)p0.super_Few<double,_2>.array_[1]._0_4_ < 3
      ; p0.super_Few<double,_2>.array_[1]._0_4_ = p0.super_Few<double,_2>.array_[1]._0_4_ + 1) {
    pVVar3 = Few<r3d::Vector<2>,_3>::operator[](vertices,p0.super_Few<double,_2>.array_[1]._0_4_);
    Vector<2>::operator=((Vector<2> *)&p1.super_Few<double,_2>.array_[1].__align,pVVar3);
    pVVar3 = Few<r3d::Vector<2>,_3>::operator[]
                       (vertices,p0.super_Few<double,_2>.array_[1]._0_4_ + 1 +
                                 ((p0.super_Few<double,_2>.array_[1]._0_4_ + 1) / 3) * -3);
    Vector<2>::operator=((Vector<2> *)local_40,pVVar3);
    pdVar4 = Few<double,_2>::operator[]
                       ((Few<double,_2> *)&p1.super_Few<double,_2>.array_[1].__align,1);
    dVar1 = *pdVar4;
    pdVar4 = Few<double,_2>::operator[]((Few<double,_2> *)local_40,1);
    dVar2 = *pdVar4;
    pPVar5 = Few<r3d::Plane<2>,_3>::operator[]
                       (__return_storage_ptr__,p0.super_Few<double,_2>.array_[1]._0_4_);
    pdVar4 = Few<double,_2>::operator[]((Few<double,_2> *)pPVar5,0);
    *pdVar4 = dVar1 - dVar2;
    pdVar4 = Few<double,_2>::operator[]((Few<double,_2> *)local_40,0);
    dVar1 = *pdVar4;
    pdVar4 = Few<double,_2>::operator[]
                       ((Few<double,_2> *)&p1.super_Few<double,_2>.array_[1].__align,0);
    dVar2 = *pdVar4;
    pPVar5 = Few<r3d::Plane<2>,_3>::operator[]
                       (__return_storage_ptr__,p0.super_Few<double,_2>.array_[1]._0_4_);
    pdVar4 = Few<double,_2>::operator[]((Few<double,_2> *)pPVar5,1);
    *pdVar4 = dVar1 - dVar2;
    pPVar5 = Few<r3d::Plane<2>,_3>::operator[]
                       (__return_storage_ptr__,p0.super_Few<double,_2>.array_[1]._0_4_);
    Vector<2>::Vector(&local_70,&pPVar5->n);
    normalize<2>((r3d *)&local_60,&local_70);
    pPVar5 = Few<r3d::Plane<2>,_3>::operator[]
                       (__return_storage_ptr__,p0.super_Few<double,_2>.array_[1]._0_4_);
    Vector<2>::operator=(&pPVar5->n,&local_60);
    Vector<2>::~Vector(&local_60);
    Vector<2>::~Vector(&local_70);
    pPVar5 = Few<r3d::Plane<2>,_3>::operator[]
                       (__return_storage_ptr__,p0.super_Few<double,_2>.array_[1]._0_4_);
    Vector<2>::Vector(&local_80,&pPVar5->n);
    Vector<2>::Vector(&local_90,(Vector<2> *)&p1.super_Few<double,_2>.array_[1].__align);
    RVar6 = operator*(&local_80,&local_90);
    pPVar5 = Few<r3d::Plane<2>,_3>::operator[]
                       (__return_storage_ptr__,p0.super_Few<double,_2>.array_[1]._0_4_);
    pPVar5->d = -RVar6;
    Vector<2>::~Vector(&local_90);
    Vector<2>::~Vector(&local_80);
  }
  local_4d = 1;
  Vector<2>::~Vector((Vector<2> *)local_40);
  Vector<2>::~Vector((Vector<2> *)&p1.super_Few<double,_2>.array_[1].__align);
  return __return_storage_ptr__;
}

Assistant:

R3D_INLINE Few<Plane<2>, 3> faces_from_verts(Few<Vector<2>, 3> vertices) {
  constexpr Int numverts = 3;
  Int f;
  Vector<2> p0, p1;
  Few<Plane<2>, 3> faces;
  // calculate a centroid and a unit normal for each face
  for (f = 0; f < numverts; ++f) {
    p0 = vertices[f];
    p1 = vertices[(f + 1) % numverts];
    // normal of the edge
    faces[f].n[0] = p0[1] - p1[1];
    faces[f].n[1] = p1[0] - p0[0];
    // normalize the normals and set the signed distance to origin
    faces[f].n = normalize(faces[f].n);
    faces[f].d = -(faces[f].n * p0);
  }
  return faces;
}